

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStringObject.cpp
# Opt level: O0

bool __thiscall
Js::JavascriptStringObject::GetSetterBuiltIns
          (JavascriptStringObject *this,PropertyId propertyId,PropertyValueInfo *info,
          DescriptorFlags *descriptorFlags)

{
  DescriptorFlags *descriptorFlags_local;
  PropertyValueInfo *info_local;
  PropertyId propertyId_local;
  JavascriptStringObject *this_local;
  
  if (propertyId == 0xd1) {
    PropertyValueInfo::SetNoCache(info,(RecyclableObject *)this);
    *descriptorFlags = Data;
  }
  return propertyId == 0xd1;
}

Assistant:

bool JavascriptStringObject::GetSetterBuiltIns(PropertyId propertyId, PropertyValueInfo* info, DescriptorFlags* descriptorFlags)
    {
        if (propertyId == PropertyIds::length)
        {
            PropertyValueInfo::SetNoCache(info, this);
            *descriptorFlags = Data;
            return true;
        }

        return false;
    }